

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O1

int __thiscall
ncnn::MultiHeadAttention::forward
          (MultiHeadAttention *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer pMVar5;
  Mat *this_00;
  size_t sVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  int *piVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int j_1;
  long lVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  void *pvVar25;
  void *pvVar26;
  ulong uVar27;
  ulong uVar28;
  int j;
  long lVar29;
  ulong uVar30;
  long lVar31;
  int j_2;
  long lVar32;
  long lVar33;
  void *pvVar34;
  void *pvVar35;
  long lVar36;
  bool bVar37;
  float sum;
  float fVar38;
  float fVar39;
  float fVar40;
  Mat xqkv;
  Mat xqk;
  Mat xv;
  Mat xk;
  Mat xq;
  long local_2b0;
  long local_2a0;
  long local_290;
  void *local_288;
  long local_280;
  void *local_260;
  void *local_258;
  Mat local_1b8;
  Mat local_168;
  Mat local_118;
  Mat local_c8;
  Mat local_78;
  
  pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  bVar37 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pMVar5 == 0x48;
  lVar31 = 0x48;
  if (bVar37) {
    lVar31 = 0;
  }
  lVar14 = 0x90;
  if (bVar37) {
    lVar14 = 0;
  }
  uVar1 = pMVar5->h;
  uVar16 = (ulong)uVar1;
  uVar28 = (long)this->embed_dim / (long)this->num_head;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,this->embed_dim,uVar1,4,opt->blob_allocator);
  iVar17 = -1;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78.elemsize._4_4_ = 0;
    local_78.elempack = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    iVar17 = (int)uVar28;
    Mat::create(&local_78,iVar17,uVar1,this->num_head,4,opt->workspace_allocator);
    local_c8.cstep = 0;
    local_c8.data = (void *)0x0;
    local_c8.refcount._0_4_ = 0;
    local_c8.refcount._4_4_ = 0;
    local_c8.elemsize._0_4_ = 0;
    local_c8.elemsize._4_4_ = 0;
    local_c8.elempack = 0;
    local_c8.allocator = (Allocator *)0x0;
    local_c8.dims = 0;
    local_c8.w = 0;
    local_c8.h = 0;
    local_c8.d = 0;
    local_c8.c = 0;
    Mat::create(&local_c8,iVar17,uVar1,this->num_head,4,opt->workspace_allocator);
    local_118.cstep = 0;
    local_118.data = (void *)0x0;
    local_118.refcount._0_4_ = 0;
    local_118.refcount._4_4_ = 0;
    local_118.elemsize._0_4_ = 0;
    local_118.elemsize._4_4_ = 0;
    local_118.elempack = 0;
    local_118.allocator = (Allocator *)0x0;
    local_118.dims = 0;
    local_118.w = 0;
    local_118.h = 0;
    local_118.d = 0;
    local_118.c = 0;
    Mat::create(&local_118,uVar1,iVar17,this->num_head,4,opt->workspace_allocator);
    local_168.cstep = 0;
    local_168.data = (void *)0x0;
    local_168.refcount._0_4_ = 0;
    local_168.refcount._4_4_ = 0;
    local_168.elemsize._0_4_ = 0;
    local_168.elemsize._4_4_ = 0;
    local_168.elempack = 0;
    local_168.allocator = (Allocator *)0x0;
    local_168.dims = 0;
    local_168.w = 0;
    local_168.h = 0;
    local_168.d = 0;
    local_168.c = 0;
    Mat::create(&local_168,uVar1,uVar1,this->num_head,4,opt->workspace_allocator);
    local_1b8.cstep = 0;
    local_1b8.data = (void *)0x0;
    local_1b8.refcount._0_4_ = 0;
    local_1b8.refcount._4_4_ = 0;
    local_1b8.elemsize._0_4_ = 0;
    local_1b8.elemsize._4_4_ = 0;
    local_1b8.elempack = 0;
    local_1b8.allocator = (Allocator *)0x0;
    local_1b8.dims = 0;
    local_1b8.w = 0;
    local_1b8.h = 0;
    local_1b8.d = 0;
    local_1b8.c = 0;
    Mat::create(&local_1b8,iVar17,this->num_head,uVar1,4,opt->workspace_allocator);
    pvVar9 = local_78.data;
    pvVar8 = local_c8.data;
    pvVar7 = local_118.data;
    if (0 < this->num_head) {
      lVar15 = (long)iVar17;
      lVar18 = local_78.cstep * CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
      lVar29 = (long)local_78.w * CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
      uVar28 = uVar28 & 0xffffffff;
      lVar13 = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
      lVar19 = local_c8.cstep * lVar13;
      lVar20 = (long)local_c8.w;
      lVar12 = CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize);
      lVar21 = local_118.cstep * lVar12;
      lVar22 = (long)local_118.w;
      lVar11 = CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize);
      lVar23 = local_168.cstep * lVar11;
      lVar24 = (long)local_168.w;
      iVar2 = this->num_head;
      local_280 = 0;
      local_258 = local_168.data;
      local_260 = local_168.data;
      local_288 = local_78.data;
      local_290 = 0;
      local_2a0 = 0;
      local_2b0 = 0;
      do {
        if (0 < (int)uVar1) {
          iVar3 = this->embed_dim;
          pvVar25 = (this->q_bias_data).data;
          pvVar26 = (this->q_weight_data).data;
          uVar27 = 0;
          do {
            if (0 < iVar17) {
              iVar4 = pMVar5->w;
              sVar6 = pMVar5->elemsize;
              pvVar35 = pMVar5->data;
              uVar30 = 0;
              pvVar34 = (void *)(local_2a0 * iVar3 + (long)pvVar26);
              do {
                fVar38 = *(float *)((long)pvVar25 + (uVar30 + local_2b0 * lVar15) * 4);
                if (0 < iVar3) {
                  lVar32 = 0;
                  do {
                    fVar38 = fVar38 + *(float *)((long)pvVar34 + lVar32 * 4) *
                                      *(float *)((long)pvVar35 +
                                                lVar32 * 4 + sVar6 * uVar27 * (long)iVar4);
                    lVar32 = lVar32 + 1;
                  } while (iVar3 != (int)lVar32);
                }
                *(float *)((long)pvVar9 + uVar30 * 4 + lVar29 * uVar27 + lVar18 * local_2b0) =
                     fVar38 * (1.0 / SQRT((float)iVar17));
                uVar30 = uVar30 + 1;
                pvVar34 = (void *)((long)pvVar34 + (long)iVar3 * 4);
              } while (uVar30 != uVar28);
            }
            uVar27 = uVar27 + 1;
          } while (uVar27 != uVar16);
        }
        if (0 < (int)uVar1) {
          iVar3 = this->embed_dim;
          pvVar25 = (this->k_bias_data).data;
          pvVar26 = (this->k_weight_data).data;
          uVar27 = 0;
          do {
            if (0 < iVar17) {
              iVar4 = *(int *)((long)&pMVar5->w + lVar31);
              lVar32 = *(long *)((long)&pMVar5->elemsize + lVar31);
              lVar36 = *(long *)((long)&pMVar5->data + lVar31);
              uVar30 = 0;
              pvVar35 = (void *)(local_2a0 * iVar3 + (long)pvVar26);
              do {
                fVar38 = *(float *)((long)pvVar25 + (uVar30 + local_2b0 * lVar15) * 4);
                if (0 < iVar3) {
                  lVar33 = 0;
                  do {
                    fVar38 = fVar38 + *(float *)((long)pvVar35 + lVar33 * 4) *
                                      *(float *)(lVar32 * uVar27 * (long)iVar4 + lVar36 + lVar33 * 4
                                                );
                    lVar33 = lVar33 + 1;
                  } while (iVar3 != (int)lVar33);
                }
                *(float *)((long)pvVar8 + uVar30 * 4 + lVar20 * lVar13 * uVar27 + lVar19 * local_2b0
                          ) = fVar38;
                uVar30 = uVar30 + 1;
                pvVar35 = (void *)((long)pvVar35 + (long)iVar3 * 4);
              } while (uVar30 != uVar28);
            }
            uVar27 = uVar27 + 1;
          } while (uVar27 != uVar16);
        }
        if (0 < iVar17) {
          iVar3 = this->embed_dim;
          pvVar25 = (this->v_bias_data).data;
          pvVar26 = (void *)(local_2a0 * iVar3 + (long)(this->v_weight_data).data);
          uVar27 = 0;
          do {
            if (0 < (int)uVar1) {
              lVar32 = *(long *)((long)&pMVar5->data + lVar14);
              iVar4 = *(int *)((long)&pMVar5->w + lVar14);
              lVar36 = *(long *)((long)&pMVar5->elemsize + lVar14);
              uVar30 = 0;
              do {
                fVar38 = *(float *)((long)pvVar25 + (local_2b0 * lVar15 + uVar27) * 4);
                if (0 < iVar3) {
                  lVar33 = 0;
                  do {
                    fVar38 = fVar38 + *(float *)((long)pvVar26 + lVar33 * 4) *
                                      *(float *)(lVar32 + lVar33 * 4);
                    lVar33 = lVar33 + 1;
                  } while (iVar3 != (int)lVar33);
                }
                *(float *)((long)pvVar7 + uVar30 * 4 + lVar22 * lVar12 * uVar27 + lVar21 * local_2b0
                          ) = fVar38;
                uVar30 = uVar30 + 1;
                lVar32 = lVar32 + iVar4 * lVar36;
              } while (uVar30 != uVar16);
            }
            uVar27 = uVar27 + 1;
            pvVar26 = (void *)((long)pvVar26 + (long)iVar3 * 4);
          } while (uVar27 != uVar28);
        }
        if (0 < (int)uVar1) {
          uVar27 = 0;
          pvVar25 = local_288;
          do {
            uVar30 = 0;
            lVar32 = (long)local_c8.data + local_290;
            do {
              fVar38 = 0.0;
              if (0 < iVar17) {
                lVar36 = 0;
                do {
                  fVar38 = fVar38 + *(float *)(lVar32 + lVar36 * 4) *
                                    *(float *)((long)pvVar25 + lVar36 * 4);
                  lVar36 = lVar36 + 1;
                } while (iVar17 != (int)lVar36);
              }
              *(float *)((long)local_168.data +
                        uVar30 * 4 + local_168.w * lVar11 * uVar27 + lVar23 * local_2b0) = fVar38;
              uVar30 = uVar30 + 1;
              lVar32 = lVar32 + local_c8.w * lVar13;
            } while (uVar30 != uVar16);
            uVar27 = uVar27 + 1;
            pvVar25 = (void *)((long)pvVar25 + lVar29);
          } while (uVar27 != uVar16);
        }
        if (0 < (int)uVar1) {
          uVar27 = 0;
          pvVar25 = local_260;
          do {
            uVar30 = 0;
            fVar38 = -3.4028235e+38;
            do {
              fVar40 = *(float *)((long)pvVar25 + uVar30 * 4);
              if (fVar38 <= fVar40) {
                fVar38 = fVar40;
              }
              uVar30 = uVar30 + 1;
            } while (uVar16 != uVar30);
            fVar40 = 0.0;
            uVar30 = 0;
            do {
              fVar39 = expf(*(float *)((long)pvVar25 + uVar30 * 4) - fVar38);
              *(float *)((long)pvVar25 + uVar30 * 4) = fVar39;
              fVar40 = fVar40 + fVar39;
              uVar30 = uVar30 + 1;
            } while (uVar16 != uVar30);
            uVar30 = 0;
            do {
              *(float *)((long)pvVar25 + uVar30 * 4) =
                   *(float *)((long)pvVar25 + uVar30 * 4) * (1.0 / fVar40);
              uVar30 = uVar30 + 1;
            } while (uVar16 != uVar30);
            uVar27 = uVar27 + 1;
            pvVar25 = (void *)((long)pvVar25 + lVar24 * lVar11);
          } while (uVar27 != uVar16);
        }
        if (0 < (int)uVar1) {
          uVar27 = 0;
          pvVar25 = local_258;
          do {
            if (0 < iVar17) {
              uVar30 = 0;
              lVar32 = (long)local_118.data + local_280;
              do {
                fVar38 = 0.0;
                lVar36 = 0;
                do {
                  fVar38 = fVar38 + *(float *)(lVar32 + lVar36 * 4) *
                                    *(float *)((long)pvVar25 + lVar36 * 4);
                  lVar36 = lVar36 + 1;
                } while (uVar1 != (uint)lVar36);
                *(float *)((long)local_1b8.data +
                          uVar30 * 4 +
                          local_1b8.cstep *
                          CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize) * uVar27
                          + CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize) *
                            local_2b0 * (long)local_1b8.w) = fVar38;
                uVar30 = uVar30 + 1;
                lVar32 = lVar32 + local_118.w * lVar12;
              } while (uVar30 != uVar28);
            }
            uVar27 = uVar27 + 1;
            pvVar25 = (void *)((long)pvVar25 + lVar24 * lVar11);
          } while (uVar27 != uVar16);
        }
        local_2b0 = local_2b0 + 1;
        local_2a0 = local_2a0 + lVar15 * 4;
        local_290 = local_290 + lVar19;
        local_288 = (void *)((long)local_288 + lVar18);
        local_260 = (void *)((long)local_260 + lVar23);
        local_280 = local_280 + lVar21;
        local_258 = (void *)((long)local_258 + lVar23);
      } while (local_2b0 < iVar2);
    }
    if (0 < (int)uVar1) {
      pvVar7 = this_00->data;
      iVar17 = this_00->w;
      sVar6 = this_00->elemsize;
      uVar1 = this->embed_dim;
      pvVar8 = (this->out_weight_data).data;
      pvVar9 = (this->out_bias_data).data;
      uVar28 = 0;
      do {
        if (0 < (int)uVar1) {
          uVar27 = 0;
          pvVar25 = pvVar8;
          do {
            fVar38 = *(float *)((long)pvVar9 + uVar27 * 4);
            if (0 < (int)uVar1) {
              lVar31 = 0;
              do {
                fVar38 = fVar38 + *(float *)((long)pvVar25 + lVar31 * 4) *
                                  *(float *)((long)local_1b8.data +
                                            lVar31 * 4 +
                                            local_1b8.cstep *
                                            CONCAT44(local_1b8.elemsize._4_4_,
                                                     (undefined4)local_1b8.elemsize) * uVar28);
                lVar31 = lVar31 + 1;
              } while (uVar1 != (uint)lVar31);
            }
            *(float *)((long)pvVar7 + uVar27 * 4 + (long)iVar17 * sVar6 * uVar28) = fVar38;
            uVar27 = uVar27 + 1;
            pvVar25 = (void *)((long)pvVar25 + (long)(int)uVar1 * 4);
          } while (uVar27 != uVar1);
        }
        uVar28 = uVar28 + 1;
      } while (uVar28 != uVar16);
    }
    piVar10 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if (local_1b8.allocator == (Allocator *)0x0) {
          if (local_1b8.data != (void *)0x0) {
            free(local_1b8.data);
          }
        }
        else {
          (*(local_1b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar10 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if (local_168.allocator == (Allocator *)0x0) {
          if (local_168.data != (void *)0x0) {
            free(local_168.data);
          }
        }
        else {
          (*(local_168.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar10 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if (local_118.allocator == (Allocator *)0x0) {
          if (local_118.data != (void *)0x0) {
            free(local_118.data);
          }
        }
        else {
          (*(local_118.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar10 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          if (local_c8.data != (void *)0x0) {
            free(local_c8.data);
          }
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar10 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar17 = 0;
  }
  return iVar17;
}

Assistant:

int MultiHeadAttention::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& q_blob = bottom_blobs[0];
    const Mat& k_blob = bottom_blobs.size() == 1 ? q_blob : bottom_blobs[1];
    const Mat& v_blob = bottom_blobs.size() == 1 ? q_blob : bottom_blobs[2];

    const int seqlen = q_blob.h;
    const int embed_dim_per_head = embed_dim / num_head;

    Mat& top_blob = top_blobs[0];
    top_blob.create(embed_dim, seqlen, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -1;

    Mat xq(embed_dim_per_head, seqlen, num_head, 4u, opt.workspace_allocator);
    Mat xk(embed_dim_per_head, seqlen, num_head, 4u, opt.workspace_allocator);
    Mat xv(seqlen, embed_dim_per_head, num_head, 4u, opt.workspace_allocator);

    Mat xqk(seqlen, seqlen, num_head, 4u, opt.workspace_allocator);

    Mat xqkv(embed_dim_per_head, num_head, seqlen, 4u, opt.workspace_allocator);

    const float inv_sqrt_embed_dim_per_head = 1.f / sqrt(embed_dim_per_head);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < num_head; q++)
    {
        // xq = affine(q) * inv_sqrt_embed_dim_per_head
        {
            Mat outm = xq.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* ptr = q_blob.row(i);
                    const float* kptr = (const float*)q_weight_data + embed_dim * (q * embed_dim_per_head + j);

                    float sum = q_bias_data[q * embed_dim_per_head + j];
                    for (int k = 0; k < embed_dim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    outptr[j] = sum * inv_sqrt_embed_dim_per_head;
                }
            }
        }

        // xk = affine(k)
        {
            Mat outm = xk.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* ptr = k_blob.row(i);
                    const float* kptr = (const float*)k_weight_data + embed_dim * (q * embed_dim_per_head + j);

                    float sum = k_bias_data[q * embed_dim_per_head + j];
                    for (int k = 0; k < embed_dim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }

        // xv = affine(v)
        {
            Mat outm = xv.channel(q);

            for (int i = 0; i < embed_dim_per_head; i++)
            {
                for (int j = 0; j < seqlen; j++)
                {
                    const float* ptr = v_blob.row(j);
                    const float* kptr = (const float*)v_weight_data + embed_dim * (q * embed_dim_per_head + i);

                    float sum = v_bias_data[q * embed_dim_per_head + i];
                    for (int k = 0; k < embed_dim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    float* outptr = outm.row(i);

                    outptr[j] = sum;
                }
            }
        }

        // xqk = xq * xk
        // xq  (embed_dim_per_head, seqlen)
        // xk  (embed_dim_per_head, seqlen)
        {
            const Mat xqm = xq.channel(q);
            const Mat xkm = xk.channel(q);

            Mat outm = xqk.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < seqlen; j++)
                {
                    const float* qptr = xqm.row(i);
                    const float* kptr = xkm.row(j);

                    float sum = 0.f;
                    for (int k = 0; k < embed_dim_per_head; k++)
                    {
                        sum += *qptr++ * *kptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }

        // softmax(xqk)
        {
            Mat outm = xqk.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* ptr = outm.row(i);

                float max = -FLT_MAX;
                for (int j = 0; j < seqlen; j++)
                {
                    max = std::max(max, ptr[j]);
                }

                float sum = 0.f;
                for (int j = 0; j < seqlen; j++)
                {
                    ptr[j] = (float)(exp(ptr[j] - max));
                    sum += ptr[j];
                }

                for (int j = 0; j < seqlen; j++)
                {
                    ptr[j] /= sum;
                }
            }
        }

        // xqkv = xqk * xv
        // xqk (seqlen, seqlen)
        // xv  (seqlen, embed_dim_per_head)
        // out (embed_dim_per_head, num_head, seqlen)
        {
            const Mat xqkm = xqk.channel(q);
            const Mat xvm = xv.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* outptr = xqkv.channel(i).row(q);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* qkptr = xqkm.row(i);
                    const float* vptr = xvm.row(j);

                    float sum = 0.f;
                    for (int k = 0; k < seqlen; k++)
                    {
                        sum += *qkptr++ * *vptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }
    }

    // out = affine(xqkv)
    // xqkv  (embed_dim, seqlen)
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < seqlen; i++)
    {
        float* outptr = top_blob.row(i);

        for (int j = 0; j < embed_dim; j++)
        {
            const float* ptr = xqkv.channel(i);
            const float* kptr = (const float*)out_weight_data + embed_dim * j;

            float sum = out_bias_data[j];
            for (int k = 0; k < embed_dim; k++)
            {
                sum += *ptr++ * *kptr++;
            }

            outptr[j] = sum;
        }
    }

    return 0;
}